

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.h
# Opt level: O2

StringVector * __thiscall
CoreML::Specification::OneHotEncoder::mutable_stringcategories(OneHotEncoder *this)

{
  StringVector *this_00;
  
  if (this->_oneof_case_[0] == 1) {
    this_00 = (this->CategoryType_).stringcategories_;
  }
  else {
    clear_CategoryType(this);
    this->_oneof_case_[0] = 1;
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->CategoryType_).stringcategories_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::StringVector* OneHotEncoder::mutable_stringcategories() {
  if (!has_stringcategories()) {
    clear_CategoryType();
    set_has_stringcategories();
    CategoryType_.stringcategories_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.OneHotEncoder.stringCategories)
  return CategoryType_.stringcategories_;
}